

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

size_t FindFirstOfSet(string *where_from,size_t pos,char *delim)

{
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  char *in_RDX;
  ulong in_RSI;
  ulong in_RDI;
  bool bVar4;
  undefined8 local_18;
  undefined8 local_8;
  
  local_18 = in_RSI;
  while( true ) {
    pcVar2 = (char *)std::__cxx11::string::operator[](in_RDI);
    bVar1 = ChrCmp(*pcVar2,in_RDX);
    bVar4 = false;
    if (!bVar1) {
      uVar3 = std::__cxx11::string::size();
      bVar4 = local_18 < uVar3;
    }
    if (!bVar4) break;
    local_18 = local_18 + 1;
  }
  uVar3 = std::__cxx11::string::size();
  if (local_18 == uVar3) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    local_8 = local_18;
  }
  return local_8;
}

Assistant:

size_t FindFirstOfSet(const std::string& where_from, size_t pos, const char* delim)
{ 
    while ((!ChrCmp(where_from[pos], delim)) && (pos < where_from.size()))
        pos++;
    
    if (pos == where_from.size())
        return std::string::npos;
    else
        return pos;
}